

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void roaring_bitmap_and_inplace(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  uint16_t x;
  ushort x_00;
  int iVar1;
  container_t *c;
  uint8_t uVar2;
  _Bool _Var3;
  uint uVar4;
  uint pos;
  container_t *c_00;
  long lVar5;
  int pos_00;
  ulong uVar6;
  byte type2;
  ulong uVar7;
  uint8_t result_type;
  byte local_69;
  container_t *local_68;
  undefined8 local_60;
  uint local_58;
  int local_54;
  roaring_array_t *local_50;
  int32_t local_44;
  container_t *local_40;
  container_t *local_38;
  
  if (x1 == x2) {
    return;
  }
  iVar1 = (x1->high_low_container).size;
  local_44 = (x2->high_low_container).size;
  local_54 = 0;
  uVar6 = 0;
  pos = 0;
  local_50 = &x2->high_low_container;
LAB_0011e1f1:
  do {
    uVar7 = uVar6 & 0xffff;
    while( true ) {
      if ((iVar1 <= (int)pos) || (pos_00 = (int)uVar6, local_44 <= pos_00)) {
        for (lVar5 = (long)(int)pos; lVar5 < iVar1; lVar5 = lVar5 + 1) {
          container_free((x1->high_low_container).containers[lVar5],
                         (x1->high_low_container).typecodes[lVar5]);
        }
        ra_downsize(&x1->high_low_container,local_54);
        return;
      }
      uVar4 = pos & 0xffff;
      x = (x1->high_low_container).keys[uVar4];
      x_00 = local_50->keys[uVar7];
      if (x == x_00) {
        local_69 = (x1->high_low_container).typecodes[uVar4];
        c = (x1->high_low_container).containers[uVar4];
        type2 = local_50->typecodes[uVar7];
        local_58 = CONCAT31(local_58._1_3_,local_69);
        if (local_69 != 4) {
          local_68 = local_50->containers[uVar7];
          local_38 = c;
          local_40 = get_writable_copy_if_shared(c,&local_69);
          if (type2 == 4) {
            type2 = *(byte *)((long)local_68 + 8);
          }
          local_60 = 0;
          (*(code *)(&DAT_0012a888 +
                    *(int *)(&DAT_0012a888 + (ulong)(((uint)type2 + (uint)local_69 * 4) - 5) * 4)))
                    ();
          return;
        }
        c_00 = container_and(c,'\x04',local_50->containers[uVar7],type2,&result_type);
        if (c_00 != c) {
          container_free(c,(uint8_t)local_58);
        }
        uVar2 = result_type;
        local_58 = (uint)result_type;
        local_68 = c_00;
        _Var3 = container_nonzero_cardinality(c_00,result_type);
        if (_Var3) {
          lVar5 = (long)local_54;
          (x1->high_low_container).keys[lVar5] = x;
          (x1->high_low_container).containers[lVar5] = local_68;
          (x1->high_low_container).typecodes[lVar5] = uVar2;
          local_54 = local_54 + 1;
        }
        else {
          container_free(local_68,(uint8_t)local_58);
        }
        pos = pos + 1;
        uVar6 = (ulong)(pos_00 + 1);
        goto LAB_0011e1f1;
      }
      if (x_00 <= x) break;
      pos = ra_advance_until_freeing(&x1->high_low_container,x_00,pos);
    }
    uVar4 = ra_advance_until(local_50,x,pos_00);
    uVar6 = (ulong)uVar4;
  } while( true );
}

Assistant:

void roaring_bitmap_and_inplace(roaring_bitmap_t *x1,
                                const roaring_bitmap_t *x2) {
    if (x1 == x2) return;
    int pos1 = 0, pos2 = 0, intersection_size = 0;
    const int length1 = ra_get_size(&x1->high_low_container);
    const int length2 = ra_get_size(&x2->high_low_container);

    // any skipped-over or newly emptied containers in x1
    // have to be freed.
    while (pos1 < length1 && pos2 < length2) {
        const uint16_t s1 =
            ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
        const uint16_t s2 =
            ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);

        if (s1 == s2) {
            uint8_t type1, type2, result_type;
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);

            // We do the computation "in place" only when c1 is not a shared
            // container. Rationale: using a shared container safely with in
            // place computation would require making a copy and then doing the
            // computation in place which is likely less efficient than avoiding
            // in place entirely and always generating a new container.
            container_t *c =
                (type1 == SHARED_CONTAINER_TYPE)
                    ? container_and(c1, type1, c2, type2, &result_type)
                    : container_iand(c1, type1, c2, type2, &result_type);

            if (c != c1) {  // in this instance a new container was created, and
                            // we need to free the old one
                container_free(c1, type1);
            }
            if (container_nonzero_cardinality(c, result_type)) {
                ra_replace_key_and_container_at_index(&x1->high_low_container,
                                                      intersection_size, s1, c,
                                                      result_type);
                intersection_size++;
            } else {
                container_free(c, result_type);
            }
            ++pos1;
            ++pos2;
        } else if (s1 < s2) {
            pos1 = ra_advance_until_freeing(&x1->high_low_container, s2, pos1);
        } else {  // s1 > s2
            pos2 = ra_advance_until(&x2->high_low_container, s1, pos2);
        }
    }

    // if we ended early because x2 ran out, then all remaining in x1 should be
    // freed
    while (pos1 < length1) {
        container_free(x1->high_low_container.containers[pos1],
                       x1->high_low_container.typecodes[pos1]);
        ++pos1;
    }

    // all containers after this have either been copied or freed
    ra_downsize(&x1->high_low_container, intersection_size);
}